

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O1

REF_STATUS ref_metric_buffer(REF_DBL *metric,REF_GRID ref_grid)

{
  REF_MPI ref_mpi;
  REF_NODE pRVar1;
  REF_DBL *pRVar2;
  uint uVar3;
  REF_NODE pRVar4;
  long lVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  REF_DBL xmax;
  REF_DBL rmax;
  REF_DBL r;
  REF_DBL x;
  REF_DBL diag_system [12];
  double local_c8;
  double local_c0;
  REF_DBL *local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  
  ref_mpi = ref_grid->mpi;
  pRVar1 = ref_grid->node;
  local_c8 = -1e-100;
  local_c0 = 0.0;
  pRVar4 = ref_grid->node;
  if (0 < pRVar4->max) {
    lVar5 = 0;
    lVar6 = 0;
    do {
      if (-1 < pRVar4->global[lVar6]) {
        pRVar2 = pRVar1->real;
        dVar7 = *(double *)((long)pRVar2 + lVar5 + 8);
        dVar8 = *(double *)((long)pRVar2 + lVar5 + 0x10);
        dVar7 = dVar8 * dVar8 +
                *(double *)((long)pRVar2 + lVar5) * *(double *)((long)pRVar2 + lVar5) +
                dVar7 * dVar7;
        if (dVar7 < 0.0) {
          local_b0 = sqrt(dVar7);
        }
        else {
          local_b0 = SQRT(dVar7);
        }
        if (local_c0 <= local_b0) {
          local_c0 = local_b0;
        }
        dVar7 = *(double *)((long)pRVar1->real + lVar5);
        if (local_c8 <= dVar7) {
          local_c8 = dVar7;
        }
      }
      lVar6 = lVar6 + 1;
      pRVar4 = ref_grid->node;
      lVar5 = lVar5 + 0x78;
    } while (lVar6 < pRVar4->max);
  }
  local_b0 = local_c0;
  uVar3 = ref_mpi_max(ref_mpi,&local_b0,&local_c0,3);
  if (uVar3 == 0) {
    local_b8 = metric;
    uVar3 = ref_mpi_bcast(ref_mpi,&local_c0,1,3);
    if (uVar3 == 0) {
      local_a0 = local_c8;
      uVar3 = ref_mpi_max(ref_mpi,&local_a0,&local_c8,3);
      if (uVar3 == 0) {
        uVar3 = ref_mpi_bcast(ref_mpi,&local_c8,1,3);
        if (uVar3 == 0) {
          pRVar4 = ref_grid->node;
          if (pRVar4->max < 1) {
            uVar3 = 0;
          }
          else {
            lVar5 = 2;
            lVar6 = 0;
            do {
              if (-1 < pRVar4->global[lVar6]) {
                uVar3 = ref_matrix_diag_m(local_b8,&local_98);
                if (uVar3 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                         ,0x881,"ref_metric_buffer",(ulong)uVar3,"eigen decomp");
                  return uVar3;
                }
                pRVar2 = pRVar1->real;
                dVar7 = pRVar2[lVar5] * pRVar2[lVar5] +
                        pRVar2[lVar5 + -2] * pRVar2[lVar5 + -2] +
                        pRVar2[lVar5 + -1] * pRVar2[lVar5 + -1];
                if (dVar7 < 0.0) {
                  local_b0 = sqrt(dVar7);
                }
                else {
                  local_b0 = SQRT(dVar7);
                }
                dVar7 = 1.0;
                if (local_b0 / local_c8 <= 1.0) {
                  dVar7 = local_b0 / local_c8;
                }
                dVar8 = dVar7 + dVar7;
                if (1.0 <= dVar8) {
                  dVar8 = 1.0;
                }
                dVar8 = (1.0 - dVar8) * -15.0 + dVar8 * -4.0;
                if ((0.5 < dVar7) && (dVar7 < 0.9)) {
                  dVar8 = (dVar7 + -0.5) / 0.4;
                  dVar8 = (1.0 - dVar8) * -4.0 - dVar8;
                }
                local_a8 = local_c0;
                dVar8 = pow(10.0,(double)(~-(ulong)(dVar7 < 0.9) & 0xbff0000000000000 |
                                         (ulong)dVar8 & -(ulong)(dVar7 < 0.9)));
                dVar8 = dVar8 * local_a8;
                dVar7 = dVar8 * 1e+20 * dVar8;
                if (dVar7 <= -dVar7) {
                  dVar7 = -dVar7;
                }
                if (1.0 < dVar7) {
                  dVar7 = 1.0 / (dVar8 * dVar8);
                  if (dVar7 <= local_98) {
                    local_98 = dVar7;
                  }
                  if (dVar7 <= local_90) {
                    local_90 = dVar7;
                  }
                  if (dVar7 <= local_88) {
                    local_88 = dVar7;
                  }
                }
                uVar3 = ref_matrix_form_m(&local_98,local_b8);
                if (uVar3 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                         ,0x8a3,"ref_metric_buffer",(ulong)uVar3,"reform m");
                  return uVar3;
                }
              }
              lVar6 = lVar6 + 1;
              pRVar4 = ref_grid->node;
              lVar5 = lVar5 + 0xf;
              local_b8 = local_b8 + 6;
              uVar3 = 0;
            } while (lVar6 < pRVar4->max);
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x87e,"ref_metric_buffer",(ulong)uVar3,"bcast");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x87d,"ref_metric_buffer",(ulong)uVar3,"mpi max");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0x87b,"ref_metric_buffer",(ulong)uVar3,"bcast");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0x87a,
           "ref_metric_buffer",(ulong)uVar3,"mpi max");
  }
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_metric_buffer(REF_DBL *metric, REF_GRID ref_grid) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_DBL diag_system[12];
  REF_DBL eig;
  REF_INT node;
  REF_DBL r, rmax, x, xmax, exponent, hmin, s, t, smin, smax, emin, emax;

  xmax = -1.0e-100;
  rmax = 0.0;
  each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
    r = sqrt(ref_node_xyz(ref_node, 0, node) * ref_node_xyz(ref_node, 0, node) +
             ref_node_xyz(ref_node, 1, node) * ref_node_xyz(ref_node, 1, node) +
             ref_node_xyz(ref_node, 2, node) * ref_node_xyz(ref_node, 2, node));
    rmax = MAX(rmax, r);
    xmax = MAX(xmax, ref_node_xyz(ref_node, 0, node));
  }
  r = rmax;
  RSS(ref_mpi_max(ref_mpi, &r, &rmax, REF_DBL_TYPE), "mpi max");
  RSS(ref_mpi_bcast(ref_mpi, &rmax, 1, REF_DBL_TYPE), "bcast");
  x = xmax;
  RSS(ref_mpi_max(ref_mpi, &x, &xmax, REF_DBL_TYPE), "mpi max");
  RSS(ref_mpi_bcast(ref_mpi, &xmax, 1, REF_DBL_TYPE), "bcast");

  each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
    RSS(ref_matrix_diag_m(&(metric[6 * node]), diag_system), "eigen decomp");

    r = sqrt(ref_node_xyz(ref_node, 0, node) * ref_node_xyz(ref_node, 0, node) +
             ref_node_xyz(ref_node, 1, node) * ref_node_xyz(ref_node, 1, node) +
             ref_node_xyz(ref_node, 2, node) * ref_node_xyz(ref_node, 2, node));

    smin = 0.5;
    smax = 0.9;
    emin = -4.0;
    emax = -1.0;

    s = MIN(1.0, r / xmax);

    t = MIN(s / smin, 1.0);
    exponent = -15.0 * (1.0 - t) + emin * t;

    if (smin < s && s < smax) {
      t = (s - smin) / (smax - smin);
      exponent = (emin) * (1.0 - t) + (emax) * (t);
    }

    if (smax <= s) {
      exponent = emax;
    }

    hmin = rmax * pow(10.0, exponent);

    if (ref_math_divisible(1.0, hmin * hmin)) {
      eig = 1.0 / (hmin * hmin);
      ref_matrix_eig(diag_system, 0) = MIN(ref_matrix_eig(diag_system, 0), eig);
      ref_matrix_eig(diag_system, 1) = MIN(ref_matrix_eig(diag_system, 1), eig);
      ref_matrix_eig(diag_system, 2) = MIN(ref_matrix_eig(diag_system, 2), eig);
    }

    RSS(ref_matrix_form_m(diag_system, &(metric[6 * node])), "reform m");
  }
  return REF_SUCCESS;
}